

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  undefined1 auVar1 [16];
  ImVec2 IVar2;
  ImVec2 IVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  IVar2 = window->Scroll;
  fVar6 = (window->ScrollTarget).x;
  if (fVar6 < 3.4028235e+38) {
    IVar2.x = fVar6 - ((window->SizeFull).x - (window->ScrollbarSizes).x) *
                      (window->ScrollTargetCenterRatio).x;
  }
  fVar6 = (window->ScrollTarget).y;
  if (fVar6 < 3.4028235e+38) {
    fVar7 = (window->ScrollTargetCenterRatio).y;
    if (((snap_on_edges) && (fVar7 <= 0.0)) && (fVar6 <= (window->WindowPadding).y)) {
      fVar6 = 0.0;
    }
    if (((snap_on_edges) && (1.0 <= fVar7)) &&
       (fVar8 = (window->SizeContents).y,
       (fVar8 - (window->WindowPadding).y) + (GImGui->Style).ItemSpacing.y <= fVar6)) {
      fVar6 = fVar8;
    }
    fVar9 = 0.0;
    fVar8 = 0.0;
    if ((window->Flags & 1U) == 0) {
      fVar8 = (GImGui->Style).FramePadding.y;
      fVar8 = fVar8 + fVar8 + GImGui->FontBaseSize * window->FontWindowScale;
    }
    if (((uint)window->Flags >> 10 & 1) != 0) {
      fVar9 = (GImGui->Style).FramePadding.y;
      fVar9 = fVar9 + fVar9 +
              GImGui->FontBaseSize * window->FontWindowScale + (window->DC).MenuBarOffset.y;
    }
    fVar5 = IVar2.x;
    IVar2.y = (fVar6 - (1.0 - fVar7) * (fVar8 + fVar9)) -
              fVar7 * ((window->SizeFull).y - (window->ScrollbarSizes).y);
    IVar2.x = fVar5;
  }
  IVar3.x = (float)(-(uint)(0.0 <= IVar2.x) & (uint)IVar2.x);
  IVar3.y = (float)(-(uint)(0.0 <= IVar2.y) & (uint)IVar2.y);
  auVar4._8_8_ = 0;
  auVar4._0_4_ = IVar3.x;
  auVar4._4_4_ = IVar3.y;
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    fVar6 = (window->SizeContents).x - ((window->SizeFull).x - (window->ScrollbarSizes).x);
    fVar7 = (window->SizeContents).y - ((window->SizeFull).y - (window->ScrollbarSizes).y);
    auVar1._4_4_ = -(uint)(0.0 < fVar7) & (uint)fVar7;
    auVar1._0_4_ = -(uint)(0.0 < fVar6) & (uint)fVar6;
    auVar1._8_8_ = 0;
    auVar4 = minps(auVar4,auVar1);
    IVar3 = auVar4._0_8_;
  }
  return IVar3;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        scroll.x = window->ScrollTarget.x - cr_x * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->SizeContents.y - window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->SizeContents.y;
        scroll.y = target_y - (1.0f - cr_y) * (window->TitleBarHeight() + window->MenuBarHeight()) - cr_y * (window->SizeFull.y - window->ScrollbarSizes.y);
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, ImGui::GetWindowScrollMaxX(window));
        scroll.y = ImMin(scroll.y, ImGui::GetWindowScrollMaxY(window));
    }
    return scroll;
}